

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

BinaryOperator * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::BinaryOperator,LLVMBC::Value*&,LLVMBC::Value*&,LLVMBC::Instruction::BinaryOps>
          (LLVMContext *this,Value **u,Value **u_1,BinaryOps *u_2)

{
  BinaryOperator *this_00;
  
  this_00 = (BinaryOperator *)allocate(this,0x78,8);
  if (this_00 != (BinaryOperator *)0x0) {
    BinaryOperator::BinaryOperator(this_00,*u,*u_1,*u_2);
    append_typed_destructor<LLVMBC::BinaryOperator>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}